

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::String> * __thiscall
kj::decodeUtf32(EncodingResult<kj::String> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char32_t> utf16)

{
  EncodingResult<kj::String> *pEVar1;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  undefined8 extraout_RAX;
  char32_t *pcVar5;
  char32_t *pcVar6;
  char32_t u;
  Vector<char> result;
  byte local_9c;
  byte local_9b;
  byte local_9a;
  byte local_99;
  undefined8 local_98;
  char32_t local_8c;
  Array<char> local_88;
  EncodingResult<kj::String> *local_70;
  ArrayBuilder<char> local_68;
  Array<char> local_48;
  
  pcVar5 = utf16.ptr;
  local_70 = __return_storage_ptr__;
  local_68.ptr = _::HeapArrayDisposer::allocateUninitialized<char>((long)pcVar5 + 1);
  local_68.endPtr = local_68.ptr + (long)pcVar5 + 1;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_98 = 0;
  local_68.pos = local_68.ptr;
  for (pcVar6 = (char32_t *)0x0; pcVar5 != pcVar6; pcVar6 = (char32_t *)((long)pcVar6 + 1)) {
    local_8c = *(char32_t *)(this + (long)pcVar6 * 4);
    if ((uint)local_8c < 0x80) {
      Vector<char>::add<char32_t&>((Vector<char> *)&local_68,&local_8c);
    }
    else {
      bVar4 = (byte)local_8c;
      if ((uint)local_8c < 0x800) {
        local_9c = (byte)((uint)local_8c >> 6) | 0xc0;
        local_9b = bVar4 & 0x3f | 0x80;
        local_88.ptr = (char *)&local_9c;
        local_88.size_ = 2;
        Vector<char>::addAll<std::initializer_list<char>>
                  ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
      }
      else if ((uint)local_8c < 0x10000) {
        if ((local_8c & 0xf800U) == 0xd800) {
          local_98 = 0xd801;
        }
        local_9c = (byte)((uint)local_8c >> 0xc) | 0xe0;
        local_9b = (byte)((uint)local_8c >> 6) & 0x3f | 0x80;
        local_9a = bVar4 & 0x3f | 0x80;
        local_88.ptr = (char *)&local_9c;
        local_88.size_ = 3;
        Vector<char>::addAll<std::initializer_list<char>>
                  ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
      }
      else if ((uint)local_8c < 0x110000) {
        local_9c = (byte)((uint)local_8c >> 0x12) | 0xf0;
        local_9b = (byte)((uint)local_8c >> 0xc) & 0x3f | 0x80;
        local_9a = (byte)((uint)local_8c >> 6) & 0x3f | 0x80;
        local_99 = bVar4 & 0x3f | 0x80;
        local_88.ptr = (char *)&local_9c;
        local_88.size_ = 4;
        Vector<char>::addAll<std::initializer_list<char>>
                  ((Vector<char> *)&local_68,(initializer_list<char> *)&local_88);
      }
      else {
        local_88.ptr = anon_var_dwarf_8b029d;
        local_88.size_ = 4;
        Vector<char>::addAll<kj::StringPtr>((Vector<char> *)&local_68,(StringPtr *)&local_88);
        local_98 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
    }
  }
  local_88.ptr = (char *)((ulong)local_88.ptr & 0xffffffff00000000);
  Vector<char>::add<int>((Vector<char> *)&local_68,(int *)&local_88);
  Vector<char>::releaseAsArray(&local_48,(Vector<char> *)&local_68);
  sVar3 = local_48.size_;
  pcVar2 = local_48.ptr;
  pEVar1 = local_70;
  local_88.disposer = local_48.disposer;
  local_48.ptr = (char *)0x0;
  local_48.size_ = 0;
  (local_70->super_String).content.ptr = pcVar2;
  (local_70->super_String).content.size_ = sVar3;
  (local_70->super_String).content.disposer = local_48.disposer;
  local_88.ptr = (char *)0x0;
  local_88.size_ = 0;
  local_70->hadErrors = (bool)((byte)local_98 & 1);
  Array<char>::~Array(&local_88);
  Array<char>::~Array(&local_48);
  ArrayBuilder<char>::dispose(&local_68);
  return pEVar1;
}

Assistant:

EncodingResult<String> decodeUtf32(ArrayPtr<const char32_t> utf16) {
  Vector<char> result(utf16.size() + 1);
  bool hadErrors = false;

  size_t i = 0;
  while (i < utf16.size()) {
    char32_t u = utf16[i++];

    if (u < 0x80) {
      result.add(u);
      continue;
    } else if (u < 0x0800) {
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >>  6)       ) | 0xc0),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else if (u < 0x10000) {
      if (KJ_UNLIKELY((u & 0xfffff800) == 0xd800)) {
        // no surrogates allowed in utf-32
        hadErrors = true;
      }
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 12)       ) | 0xe0),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    } else {
      GOTO_ERROR_IF(u >= 0x110000);  // outside Unicode range
      result.addAll<std::initializer_list<char>>({
        static_cast<char>(((u >> 18)       ) | 0xf0),
        static_cast<char>(((u >> 12) & 0x3f) | 0x80),
        static_cast<char>(((u >>  6) & 0x3f) | 0x80),
        static_cast<char>(((u      ) & 0x3f) | 0x80)
      });
      continue;
    }

  error:
    result.addAll(StringPtr(u8"\ufffd"));
    hadErrors = true;
  }

  result.add(0);
  return { String(result.releaseAsArray()), hadErrors };
}